

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Server_run_startup(UA_Server *server)

{
  UA_StatusCode UVar1;
  UA_ServerNetworkLayer *pUVar2;
  UA_ServerNetworkLayer *nl;
  size_t i;
  UA_StatusCode result;
  UA_Server *server_local;
  
  i._4_4_ = 0;
  for (nl = (UA_ServerNetworkLayer *)0x0;
      nl < (UA_ServerNetworkLayer *)(server->config).networkLayersSize;
      nl = (UA_ServerNetworkLayer *)((long)&nl->handle + 1)) {
    pUVar2 = (server->config).networkLayers + (long)nl;
    UVar1 = (*pUVar2->start)(pUVar2,(server->config).logger);
    i._4_4_ = UVar1 | i._4_4_;
  }
  return i._4_4_;
}

Assistant:

UA_StatusCode UA_Server_run_startup(UA_Server *server) {
#ifdef UA_ENABLE_MULTITHREADING
    /* Spin up the worker threads */
    UA_LOG_INFO(server->config.logger, UA_LOGCATEGORY_SERVER,
                "Spinning up %u worker thread(s)", server->config.nThreads);
    pthread_cond_init(&server->dispatchQueue_condition, 0);
    pthread_mutex_init(&server->dispatchQueue_mutex, 0);
    server->workers = UA_malloc(server->config.nThreads * sizeof(UA_Worker));
    if(!server->workers)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    for(size_t i = 0; i < server->config.nThreads; ++i) {
        UA_Worker *worker = &server->workers[i];
        worker->server = server;
        worker->counter = 0;
        worker->running = true;
        pthread_create(&worker->thr, NULL, (void* (*)(void*))workerLoop, worker);
    }

    /* Try to execute delayed callbacks every 10 sec */
    UA_Job processDelayed = {.type = UA_JOBTYPE_METHODCALL,
                             .job.methodCall = {.method = dispatchDelayedJobs, .data = NULL} };
    UA_Server_addRepeatedJob(server, processDelayed, 10000, NULL);
#endif

    /* Start the networklayers */
    UA_StatusCode result = UA_STATUSCODE_GOOD;
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        result |= nl->start(nl, server->config.logger);
    }

    return result;
}